

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushItemFlag(ImGuiItemFlags option,bool enabled)

{
  int iVar1;
  int *__src;
  uint uVar2;
  ImGuiContext *pIVar3;
  int *__dest;
  int iVar4;
  undefined7 in_register_00000031;
  int iVar5;
  
  pIVar3 = GImGui;
  uVar2 = GImGui->CurrentItemFlags | option;
  if ((int)CONCAT71(in_register_00000031,enabled) == 0) {
    uVar2 = ~option & GImGui->CurrentItemFlags;
  }
  iVar5 = (GImGui->ItemFlagsStack).Size;
  GImGui->CurrentItemFlags = uVar2;
  iVar1 = (pIVar3->ItemFlagsStack).Capacity;
  if (iVar5 == iVar1) {
    iVar5 = iVar5 + 1;
    if (iVar1 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar1 / 2 + iVar1;
    }
    if (iVar5 < iVar4) {
      iVar5 = iVar4;
    }
    if (iVar1 < iVar5) {
      __dest = (int *)MemAlloc((long)iVar5 << 2);
      __src = (pIVar3->ItemFlagsStack).Data;
      if (__src != (int *)0x0) {
        memcpy(__dest,__src,(long)(pIVar3->ItemFlagsStack).Size << 2);
        MemFree((pIVar3->ItemFlagsStack).Data);
      }
      (pIVar3->ItemFlagsStack).Data = __dest;
      (pIVar3->ItemFlagsStack).Capacity = iVar5;
    }
  }
  (pIVar3->ItemFlagsStack).Data[(pIVar3->ItemFlagsStack).Size] = uVar2;
  (pIVar3->ItemFlagsStack).Size = (pIVar3->ItemFlagsStack).Size + 1;
  return;
}

Assistant:

void ImGui::PushItemFlag(ImGuiItemFlags option, bool enabled)
{
    ImGuiContext& g = *GImGui;
    ImGuiItemFlags item_flags = g.CurrentItemFlags;
    IM_ASSERT(item_flags == g.ItemFlagsStack.back());
    if (enabled)
        item_flags |= option;
    else
        item_flags &= ~option;
    g.CurrentItemFlags = item_flags;
    g.ItemFlagsStack.push_back(item_flags);
}